

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_18::FunctionInfo::clear(FunctionInfo *this)

{
  FunctionInfo *this_local;
  
  std::__atomic_base<unsigned_int>::operator=((__atomic_base<unsigned_int> *)this,0);
  this->size = 0;
  this->hasCalls = false;
  this->hasLoops = false;
  this->hasTryDelegate = false;
  this->usedGlobally = false;
  this->isTrivialCall = false;
  this->inliningMode = Unknown;
  return;
}

Assistant:

void clear() {
    refs = 0;
    size = 0;
    hasCalls = false;
    hasLoops = false;
    hasTryDelegate = false;
    usedGlobally = false;
    isTrivialCall = false;
    inliningMode = InliningMode::Unknown;
  }